

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.cc
# Opt level: O0

void __thiscall bloaty::dwarf::LineInfoReader::Advance(LineInfoReader *this,uint64_t amount)

{
  uint64_t in_RSI;
  LineInfoReader *in_RDI;
  
  if ((in_RDI->params_).maximum_operations_per_instruction == '\x01') {
    DoAdvance(in_RDI,in_RSI,'\x01');
  }
  else {
    DoAdvance(in_RDI,in_RSI,(in_RDI->params_).maximum_operations_per_instruction);
  }
  return;
}

Assistant:

void LineInfoReader::Advance(uint64_t amount) {
  if (params_.maximum_operations_per_instruction == 1) {
    // This is by far the common case (only false on VLIW architectuers),
    // and this inlining/specialization avoids a costly division.
    DoAdvance(amount, 1);
  } else {
    DoAdvance(amount, params_.maximum_operations_per_instruction);
  }
}